

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O3

bool glcts::verifyImage<unsigned_int,4u>
               (GLuint image_width,GLuint image_height,uint *components,uint *image)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  if (image_height != 0) {
    uVar2 = 0;
    bVar6 = false;
    uVar3 = 0;
    do {
      if (image_width != 0) {
        uVar5 = 0;
        uVar1 = uVar2;
        do {
          lVar4 = 0;
          do {
            if (image[(ulong)uVar1 + lVar4] != components[lVar4]) {
              return bVar6;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          uVar5 = uVar5 + 1;
          uVar1 = uVar1 + 4;
        } while (uVar5 != image_width);
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + image_width * 4;
      bVar6 = image_height <= uVar3;
    } while (uVar3 != image_height);
  }
  return true;
}

Assistant:

bool verifyImage(glw::GLuint image_width, glw::GLuint image_height, const T* components, const T* image)
{
	const glw::GLuint line_size = image_width * N_Components;

	for (glw::GLuint y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * line_size;

		for (glw::GLuint x = 0; x < image_width; ++x)
		{
			const glw::GLuint pixel_offset = line_offset + x * N_Components;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (image[pixel_offset + component] != components[component])
				{
					return false;
				}
			} /* for (all components) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	return true;
}